

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,int startpos,int endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  Options *pOVar1;
  byte *pbVar2;
  RE2 *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  Prog *pPVar8;
  long lVar9;
  byte *pbVar10;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece *src_03;
  StringPiece *src_04;
  StringPiece *src_05;
  StringPiece *src_06;
  StringPiece *src_07;
  StringPiece *src_08;
  int *piVar11;
  StringPiece *src_09;
  StringPiece *src_10;
  StringPiece *src_11;
  uint uVar12;
  size_type sVar13;
  byte bVar14;
  byte *__s1;
  MatchKind kind;
  int nmatch;
  Anchor anchor;
  int iVar15;
  StringPiece *text_00;
  byte bVar16;
  size_t __n;
  Anchor AVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  bool dfa_failed;
  char local_26d;
  int local_26c;
  string local_268;
  re2 local_248 [32];
  StringPiece local_228;
  RE2 *local_218;
  Options *local_210;
  byte *local_208;
  StringPiece *local_200;
  StringPiece local_1f8;
  MatchKind local_1e4;
  StringPiece *local_1e0;
  Prog *local_1d8;
  StringPiece match;
  LogMessage local_1c0;
  pointer local_40;
  uint8 local_38 [8];
  
  if ((this->error_code_ != NoError) || (this->suffix_regexp_ == (Regexp *)0x0)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x222,2
              );
    poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Invalid RE2: ");
    std::operator<<(poVar7,(string *)this->error_);
    goto LAB_00127c59;
  }
  if ((endpos < startpos || startpos < 0) || (text->length_ < endpos)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x228,2
              );
    poVar7 = std::operator<<((ostream *)&local_1c0.str_,"RE2: invalid startpos, endpos pair. [");
    poVar7 = std::operator<<(poVar7,"startpos: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,startpos);
    poVar7 = std::operator<<(poVar7,", ");
    poVar7 = std::operator<<(poVar7,"endpos: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,endpos);
    poVar7 = std::operator<<(poVar7,", ");
    poVar7 = std::operator<<(poVar7,"text size: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,text->length_);
    std::operator<<(poVar7,"]");
    goto LAB_00127c59;
  }
  local_228.ptr_ = text->ptr_ + (uint)startpos;
  local_228.length_ = (int)*(undefined8 *)&text->length_;
  iVar15 = (endpos - (text->length_ + startpos)) + local_228.length_;
  local_228._12_4_ = SUB84((ulong)*(undefined8 *)&text->length_ >> 0x20,0);
  local_228.length_ = iVar15;
  match.ptr_ = (char *)0x0;
  match.length_ = 0;
  local_1d8 = (Prog *)0x0;
  if (nsubmatch != 0) {
    local_1d8 = (Prog *)&match;
  }
  local_208 = (byte *)local_228.ptr_;
  local_200 = text;
  local_1e0 = submatch;
  iVar6 = NumberOfCapturingGroups(this);
  nmatch = iVar6 + 1;
  if (nsubmatch <= iVar6) {
    nmatch = nsubmatch;
  }
  local_218 = this;
  pPVar8 = this->prog_;
  bVar4 = pPVar8->anchor_start_;
  if ((startpos != 0 & bVar4) != 0) {
    return false;
  }
  if ((bVar4 == false) || (pPVar8->anchor_end_ == false)) {
    AVar17 = re_anchor;
    if (bVar4 != false) {
      AVar17 = ANCHOR_START;
    }
    if (re_anchor == ANCHOR_BOTH) {
      AVar17 = re_anchor;
    }
  }
  else {
    AVar17 = ANCHOR_BOTH;
  }
  sVar13 = (this->prefix_)._M_string_length;
  uVar12 = (uint)sVar13;
  if (sVar13 == 0) {
    pOVar1 = &this->options_;
    bVar4 = (this->options_).longest_match_;
    kind = (MatchKind)bVar4;
    bVar16 = nmatch < 6 & this->is_one_pass_;
    local_26d = pPVar8->size_ < 0x1f5;
    local_208 = (byte *)CONCAT44(local_208._4_4_,(int)(0x40000 / (long)pPVar8->size_));
    dfa_failed = false;
    if (AVar17 == ANCHOR_START) {
      local_210 = pOVar1;
LAB_00127e18:
      sVar13 = 0;
      uVar12 = 0;
      local_210 = pOVar1;
      pRVar3 = local_218;
      bVar14 = bVar16;
      goto joined_r0x00127e26;
    }
    if (AVar17 == ANCHOR_BOTH) {
      local_210 = pOVar1;
      kind = kFullMatch;
      goto LAB_00127e18;
    }
    text_00 = &local_228;
    local_26c = nmatch;
    local_1e4 = (uint)bVar4;
    bVar4 = Prog::SearchDFA(pPVar8,text_00,local_200,kUnanchored,(uint)bVar4,
                            (StringPiece *)local_1d8,&dfa_failed,
                            (vector<int,_std::allocator<int>_> *)0x0);
    if (!bVar4) {
      if (dfa_failed == true) {
        local_210 = pOVar1;
        if (FLAGS_trace_re2 != 0) {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x27c,0);
          poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
          local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
          local_1f8.length_ = (int)(this->pattern_)._M_string_length;
          trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          poVar7 = std::operator<<(poVar7,(string *)local_248);
          poVar7 = std::operator<<(poVar7," [");
          CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_04);
          poVar7 = std::operator<<(poVar7,(string *)&local_268);
          poVar7 = std::operator<<(poVar7,"]");
          std::operator<<(poVar7," DFA failed.");
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)local_248);
          LogMessage::~LogMessage(&local_1c0);
        }
        uVar12 = 0;
        anchor = kUnanchored;
        nmatch = local_26c;
        kind = local_1e4;
        goto LAB_001286be;
      }
      if (FLAGS_trace_re2 == 0) {
        return false;
      }
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x282
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
      local_1f8.length_ = (int)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_09);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," used DFA - no match.");
LAB_00128c73:
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      goto LAB_00127c59;
    }
    if (FLAGS_trace_re2 == 1) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x288
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
      local_1f8.length_ = (int)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_00);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," used DFA - match");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      LogMessage::~LogMessage(&local_1c0);
    }
    if (nsubmatch == 0) {
      return true;
    }
    pPVar8 = ReverseProg(this);
    if (pPVar8 == (Prog *)0x0) {
      return false;
    }
    bVar4 = Prog::SearchDFA(pPVar8,&match,local_200,kAnchored,kLongestMatch,&match,&dfa_failed,
                            (vector<int,_std::allocator<int>_> *)0x0);
    if (bVar4) {
      local_210 = pOVar1;
      if (FLAGS_trace_re2 == 1) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2a7,0);
        poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
        local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(this->pattern_)._M_string_length;
        trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        poVar7 = std::operator<<(poVar7,(string *)local_248);
        poVar7 = std::operator<<(poVar7," [");
        CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_01);
        poVar7 = std::operator<<(poVar7,(string *)&local_268);
        poVar7 = std::operator<<(poVar7,"]");
        std::operator<<(poVar7," used reverse DFA.");
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_248);
        LogMessage::~LogMessage(&local_1c0);
      }
      uVar12 = 0;
      nmatch = local_26c;
      goto LAB_00128328;
    }
    if (dfa_failed != true) {
      if (FLAGS_trace_re2 != 0) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x29f,0);
        poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
        local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(this->pattern_)._M_string_length;
        trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
        poVar7 = std::operator<<(poVar7,(string *)local_248);
        poVar7 = std::operator<<(poVar7," [");
        CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_11);
        poVar7 = std::operator<<(poVar7,(string *)&local_268);
        poVar7 = std::operator<<(poVar7,"]");
        std::operator<<(poVar7," DFA inconsistency.");
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_248);
        LogMessage::~LogMessage(&local_1c0);
      }
      if ((this->options_).log_errors_ != true) {
        return false;
      }
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2a3
                 ,2);
      std::operator<<((ostream *)&local_1c0.str_,"DFA inconsistency");
      goto LAB_00127c59;
    }
    if (FLAGS_trace_re2 != 0) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x299
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
      local_1f8.length_ = (int)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_10);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," reverse DFA failed.");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      LogMessage::~LogMessage(&local_1c0);
    }
    local_210 = pOVar1;
    bVar4 = true;
    uVar12 = 0;
    anchor = kUnanchored;
    nmatch = local_26c;
    kind = local_1e4;
  }
  else {
    if (startpos != 0) {
      return false;
    }
    if (iVar15 < (int)uVar12) {
      return false;
    }
    local_1d8 = pPVar8;
    __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
    __n = (size_t)(int)uVar12;
    if (this->prefix_foldcase_ == true) {
      pbVar2 = __s1 + __n;
      pbVar10 = local_208;
      for (; __s1 < pbVar2; __s1 = __s1 + 1) {
        bVar16 = *pbVar10;
        bVar14 = bVar16 | 0x20;
        if (0x19 < (byte)(bVar16 + 0xbf)) {
          bVar14 = bVar16;
        }
        if (*__s1 != bVar14) {
          return false;
        }
        pbVar10 = pbVar10 + 1;
      }
    }
    else {
      iVar6 = bcmp(__s1,local_208,__n);
      if (iVar6 != 0) {
        return false;
      }
    }
    kind = kFullMatch;
    local_228.ptr_ = (char *)(local_208 + __n);
    local_228.length_ = iVar15 - uVar12;
    local_210 = &local_218->options_;
    if (AVar17 != ANCHOR_BOTH) {
      kind = (MatchKind)(local_218->options_).longest_match_;
    }
    local_26d = local_1d8->size_ < 0x1f5;
    local_208 = (byte *)CONCAT44(local_208._4_4_,(int)(0x40000 / (long)local_1d8->size_));
    bVar14 = local_218->is_one_pass_ & nmatch < 6;
    pPVar8 = local_1d8;
    pRVar3 = local_218;
joined_r0x00127e26:
    bVar16 = 0;
    local_218 = pRVar3;
    if (bVar14 == 0) {
LAB_001281b8:
      dfa_failed = false;
      if (((bool)local_26d == false) || (nmatch < 2 || (int)local_208 < local_200->length_)) {
        bVar4 = Prog::SearchDFA(pPVar8,&local_228,local_200,kAnchored,kind,&match,&dfa_failed,
                                (vector<int,_std::allocator<int>_> *)0x0);
        if (bVar4) {
LAB_00128328:
          anchor = kAnchored;
          if (nmatch < 2) {
            if (nmatch == 1) {
              local_1e0->length_ = match.length_;
              local_1e0->ptr_ = match.ptr_;
            }
            goto LAB_00128b21;
          }
          bVar4 = false;
          text_00 = &match;
          kind = kFullMatch;
          goto LAB_001286c8;
        }
        if (dfa_failed != true) {
          if (FLAGS_trace_re2 == 0) {
            return false;
          }
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2d6,0);
          poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
          local_1f8.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
          local_1f8.length_ = (int)(pRVar3->pattern_)._M_string_length;
          trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          poVar7 = std::operator<<(poVar7,(string *)local_248);
          poVar7 = std::operator<<(poVar7," [");
          CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_05);
          poVar7 = std::operator<<(poVar7,(string *)&local_268);
          poVar7 = std::operator<<(poVar7,"]");
          std::operator<<(poVar7," used DFA - no match.");
          goto LAB_00128c73;
        }
        if (FLAGS_trace_re2 != 0) {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2cf,0);
          poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
          local_1f8.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
          local_1f8.length_ = (int)(pRVar3->pattern_)._M_string_length;
          trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          poVar7 = std::operator<<(poVar7,(string *)local_248);
          poVar7 = std::operator<<(poVar7," [");
          CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_03);
          poVar7 = std::operator<<(poVar7,(string *)&local_268);
          poVar7 = std::operator<<(poVar7,"]");
          std::operator<<(poVar7," DFA failed.");
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)local_248);
          LogMessage::~LogMessage(&local_1c0);
        }
      }
      else {
        anchor = kAnchored;
        if (FLAGS_trace_re2 != 1) {
          local_26d = '\x01';
          goto LAB_001286be;
        }
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2c5,0);
        poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
        local_1f8.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(pRVar3->pattern_)._M_string_length;
        trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
        poVar7 = std::operator<<(poVar7,(string *)local_248);
        poVar7 = std::operator<<(poVar7," [");
        local_26d = '\x01';
        CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_02);
        poVar7 = std::operator<<(poVar7,(string *)&local_268);
        poVar7 = std::operator<<(poVar7,"]");
        std::operator<<(poVar7," skipping DFA for BitState.");
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_248);
        LogMessage::~LogMessage(&local_1c0);
      }
LAB_00128432:
      anchor = kAnchored;
    }
    else {
      dfa_failed = false;
      uVar12 = (uint)sVar13;
      bVar16 = 1;
      if ((0x1000 < local_200->length_) || (nmatch < 2 && 8 < local_200->length_))
      goto LAB_001281b8;
      anchor = kAnchored;
      bVar16 = 1;
      if (FLAGS_trace_re2 == 1) {
        local_26c = nmatch;
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2bd,0);
        poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
        local_1f8.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(pRVar3->pattern_)._M_string_length;
        trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar7 = std::operator<<(poVar7,(string *)local_248);
        poVar7 = std::operator<<(poVar7," [");
        CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src);
        poVar7 = std::operator<<(poVar7,(string *)&local_268);
        poVar7 = std::operator<<(poVar7,"]");
        std::operator<<(poVar7," skipping DFA for OnePass.");
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_248);
        LogMessage::~LogMessage(&local_1c0);
        nmatch = local_26c;
        goto LAB_00128432;
      }
    }
LAB_001286be:
    bVar4 = true;
    text_00 = &local_228;
  }
LAB_001286c8:
  local_1f8.length_ = text_00->length_;
  local_1f8.ptr_ = text_00->ptr_;
  if (bVar16 == 1 && anchor != kUnanchored) {
    if (FLAGS_trace_re2 == 1) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f3
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_40 = (local_218->pattern_)._M_dataplus._M_p;
      local_38._0_4_ = *(undefined4 *)&(local_218->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_06);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," using OnePass.");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      LogMessage::~LogMessage(&local_1c0);
    }
    bVar5 = Prog::SearchOnePass(local_218->prog_,&local_1f8,local_200,kAnchored,kind,local_1e0,
                                nmatch);
    if (bVar5) goto LAB_00128b21;
    if (bVar4) {
      return false;
    }
    if (local_210->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f8,2
              );
    std::operator<<((ostream *)&local_1c0.str_,"SearchOnePass inconsistency");
  }
  else if ((local_26d == '\0') || ((int)local_208 < text_00->length_)) {
    if ((FLAGS_trace_re2 & 1) != 0) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x308
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_40 = (local_218->pattern_)._M_dataplus._M_p;
      local_38._0_4_ = *(undefined4 *)&(local_218->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_08);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," using NFA.");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      LogMessage::~LogMessage(&local_1c0);
    }
    bVar5 = Prog::SearchNFA(local_218->prog_,&local_1f8,local_200,anchor,kind,local_1e0,nmatch);
    if (bVar5) goto LAB_00128b21;
    if (bVar4) {
      return false;
    }
    if (local_210->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x30d,2
              );
    std::operator<<((ostream *)&local_1c0.str_,"SearchNFA inconsistency");
  }
  else {
    if ((FLAGS_trace_re2 & 1) != 0) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2fd
                 ,0);
      poVar7 = std::operator<<((ostream *)&local_1c0.str_,"Match ");
      local_40 = (local_218->pattern_)._M_dataplus._M_p;
      local_38._0_4_ = *(undefined4 *)&(local_218->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_248,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      poVar7 = std::operator<<(poVar7,(string *)local_248);
      poVar7 = std::operator<<(poVar7," [");
      CEscape_abi_cxx11_(&local_268,(re2 *)&local_228,src_07);
      poVar7 = std::operator<<(poVar7,(string *)&local_268);
      poVar7 = std::operator<<(poVar7,"]");
      std::operator<<(poVar7," using BitState.");
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_248);
      LogMessage::~LogMessage(&local_1c0);
    }
    bVar5 = Prog::SearchBitState(local_218->prog_,&local_1f8,local_200,anchor,kind,local_1e0,nmatch)
    ;
    if (bVar5) {
LAB_00128b21:
      if ((0 < nsubmatch) && (0 < (int)uVar12)) {
        local_1e0->ptr_ = local_1e0->ptr_ + -(ulong)uVar12;
        local_1e0->length_ = local_1e0->length_ + uVar12;
      }
      lVar9 = (long)nmatch;
      piVar11 = &local_1e0[lVar9].length_;
      for (; lVar9 < nsubmatch; lVar9 = lVar9 + 1) {
        ((StringPiece *)(piVar11 + -2))->ptr_ = (char *)0x0;
        *piVar11 = 0;
        piVar11 = piVar11 + 4;
      }
      return true;
    }
    if (bVar4) {
      return false;
    }
    if (local_210->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x303,2
              );
    std::operator<<((ostream *)&local_1c0.str_,"SearchBitState inconsistency");
  }
LAB_00127c59:
  LogMessage::~LogMessage(&local_1c0);
  return false;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                int startpos,
                int endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok() || suffix_regexp_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos < 0 || startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  int prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = static_cast<int>(prefix_.size());
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // SearchBitState allocates a bit vector of size prog_->size() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->size() * text.size() but in practice is much
  // smaller.
  // Conditions for using SearchBitState:
  const int MaxBitStateProg = 500;   // prog_->size() <= Max.
  const int MaxBitStateVector = 256*1024;  // bit vector size <= Max (bits)
  bool can_bit_state = prog_->size() <= MaxBitStateProg;
  int bit_state_text_max = MaxBitStateVector / prog_->size();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used DFA - match";
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " reverse DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " DFA inconsistency.";
        if (options_.log_errors())
          LOG(ERROR) << "DFA inconsistency";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used reverse DFA.";
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for OnePass.";
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for BitState.";
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          skipped_test = true;
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using OnePass.";
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using BitState.";
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using NFA.";
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].begin() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = NULL;
  return true;
}